

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_fixed_point.cpp
# Opt level: O2

Convergence_Data * __thiscall
Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>::solve_system
          (Convergence_Data *__return_storage_ptr__,
          Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data> *this,
          Matrix_Sparse *a_matrix,Vector_Dense<double,_0UL> *x_vector,
          Vector_Dense<double,_0UL> *b_vector)

{
  Vector_Dense<double,_0UL> *this_00;
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  size_type __new_size;
  
  puVar1 = (a_matrix->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (a_matrix->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = 0;
  if (puVar1 != puVar2) {
    __new_size = ((long)puVar1 - (long)puVar2 >> 3) - 1;
  }
  this_00 = &(this->
             super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_Disa::Solver_Fixed_Point_Jacobi_Data>
             ).data.working;
  std::vector<double,_std::allocator<double>_>::resize
            (&this_00->super_vector<double,_std::allocator<double>_>,__new_size);
  __return_storage_ptr__->residual_max_0 = 0.0;
  __return_storage_ptr__->residual_max_normalised = 0.0;
  __return_storage_ptr__->residual_normalised = 0.0;
  __return_storage_ptr__->residual_max = 0.0;
  __return_storage_ptr__->residual = 0.0;
  __return_storage_ptr__->residual_0 = 0.0;
  (__return_storage_ptr__->start_time).__d.__r = 0;
  __return_storage_ptr__->iteration = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->duration).__r = 0;
  Convergence_Data::Convergence_Data(__return_storage_ptr__);
  while( true ) {
    bVar3 = Convergence_Criteria::is_converged((Convergence_Criteria *)this,__return_storage_ptr__);
    if (bVar3) break;
    forward_sweep(a_matrix,x_vector,this_00,b_vector,1.0);
    std::swap<Disa::Vector_Dense<double,0ul>>(x_vector,this_00);
    Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
              (__return_storage_ptr__,a_matrix,x_vector,b_vector);
  }
  return __return_storage_ptr__;
}

Assistant:

Convergence_Data Solver_Fixed_Point<Solver_Type::jacobi, Solver_Fixed_Point_Jacobi_Data>::solve_system(
const Matrix_Sparse& a_matrix, Vector_Dense<Scalar, 0>& x_vector, const Vector_Dense<Scalar, 0>& b_vector) {
  data.working.resize(a_matrix.size_row());
  Convergence_Data convergence_data = Convergence_Data();
  while(!data.limits.is_converged(convergence_data)) {
    forward_sweep(a_matrix, x_vector, data.working, b_vector, 1.0);
    std::swap(x_vector, data.working);
    convergence_data.update(a_matrix, x_vector, b_vector);
  }
  return convergence_data;
}